

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O3

void * worker_start(void *thr_ptr)

{
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  lzma_block *block;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  lzma_ret lVar8;
  lzma_vli lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long local_50;
  ulong local_48;
  size_t local_40;
  void *local_38;
  
  __mutex = (pthread_mutex_t *)((long)thr_ptr + 0x160);
  __cond = (pthread_cond_t *)((long)thr_ptr + 0x188);
  block = (lzma_block *)((long)thr_ptr + 0x88);
  local_38 = (void *)((long)thr_ptr + 0xb0);
  do {
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) goto LAB_001a13b1;
    while( true ) {
      uVar12 = *thr_ptr;
      if (uVar12 == 3) {
        *(undefined4 *)thr_ptr = 0;
        iVar7 = pthread_cond_signal(__cond);
        if (iVar7 != 0) goto LAB_001a1392;
        uVar12 = *thr_ptr;
      }
      if (uVar12 != 0) break;
      iVar7 = pthread_cond_wait(__cond,__mutex);
      if (iVar7 != 0) goto LAB_001a1373;
    }
    iVar7 = pthread_mutex_unlock(__mutex);
    if (iVar7 != 0) break;
    if (uVar12 == 3) {
      __assert_fail("state != THR_STOP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                    ,0x173,"void *worker_start(void *)");
    }
    if (uVar12 < 3) {
      if (*(long *)((long)thr_ptr + 0x30) != 0) {
        __assert_fail("thr->progress_in == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0xc9,"worker_state worker_encode(worker_thread *, worker_state)");
      }
      if (*(long *)((long)thr_ptr + 0x38) != 0) {
        __assert_fail("thr->progress_out == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0xca,"worker_state worker_encode(worker_thread *, worker_state)");
      }
      lVar11 = *(long *)((long)thr_ptr + 0x20);
      uVar1 = *(undefined4 *)(lVar11 + 0xc0);
      uVar2 = *(undefined8 *)(lVar11 + 0x110);
      uVar3 = *(undefined8 *)(lVar11 + 8);
      *(undefined8 *)((long)thr_ptr + 0x88) = 0;
      *(undefined4 *)((long)thr_ptr + 0x90) = uVar1;
      *(undefined4 *)((long)thr_ptr + 0x94) = 0;
      *(undefined8 *)((long)thr_ptr + 0x98) = uVar2;
      *(undefined8 *)((long)thr_ptr + 0xa0) = uVar3;
      *(long *)((long)thr_ptr + 0xa8) = lVar11 + 0x10;
      memset(local_38,0,0xa8);
      lVar8 = lzma_block_header_size(block);
      if ((lVar8 == LZMA_OK) &&
         (lVar8 = lzma_block_encoder_init
                            ((lzma_next_coder *)((long)thr_ptr + 0x40),
                             *(lzma_allocator **)((long)thr_ptr + 0x28),block), lVar8 == LZMA_OK)) {
        local_50 = 0;
        *(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8) = (ulong)*(uint *)((long)thr_ptr + 0x8c);
        local_48 = *(ulong *)(*(long *)((long)thr_ptr + 0x20) + 0x110);
        lVar11 = 0;
        do {
          iVar7 = pthread_mutex_lock(__mutex);
          if (iVar7 != 0) goto LAB_001a13b1;
          *(long *)((long)thr_ptr + 0x30) = local_50;
          *(undefined8 *)((long)thr_ptr + 0x38) =
               *(undefined8 *)(*(long *)((long)thr_ptr + 0x18) + 8);
          while( true ) {
            uVar12 = *thr_ptr;
            lVar10 = *(long *)((long)thr_ptr + 0x10);
            if ((lVar11 != *(long *)((long)thr_ptr + 0x10)) || (lVar10 = lVar11, uVar12 != 1))
            break;
            iVar7 = pthread_cond_wait(__cond,__mutex);
            if (iVar7 != 0) goto LAB_001a1373;
          }
          iVar7 = pthread_mutex_unlock(__mutex);
          uVar5 = local_48;
          if (iVar7 != 0) goto LAB_001a130a;
          if (2 < uVar12) goto LAB_001a123d;
          cVar6 = (uVar12 == 2) * '\x03';
          lVar11 = lVar10;
          if (0x4000 < (ulong)(lVar10 - local_50)) {
            cVar6 = '\0';
            lVar11 = local_50 + 0x4000;
          }
          lVar8 = (**(code **)((long)thr_ptr + 0x58))
                            (*(undefined8 *)((long)thr_ptr + 0x40),
                             *(undefined8 *)((long)thr_ptr + 0x28),
                             *(undefined8 *)((long)thr_ptr + 8),&local_50,lVar11,
                             **(undefined8 **)((long)thr_ptr + 0x18),
                             *(undefined8 **)((long)thr_ptr + 0x18) + 1,local_48,cVar6);
          if (lVar8 != LZMA_OK) {
            if (lVar8 != LZMA_STREAM_END) {
              worker_error((worker_thread *)thr_ptr,lVar8);
              uVar12 = 3;
              goto LAB_001a123d;
            }
            if (uVar12 != 2) {
              __assert_fail("state == THR_FINISH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                            ,0x11d,"worker_state worker_encode(worker_thread *, worker_state)");
            }
            lVar8 = lzma_block_header_encode
                              (block,(uint8_t *)**(undefined8 **)((long)thr_ptr + 0x18));
            if (lVar8 != LZMA_OK) goto LAB_001a1206;
            goto LAB_001a1213;
          }
          lVar11 = lVar10;
        } while (*(ulong *)(*(long *)((long)thr_ptr + 0x18) + 8) < uVar5);
        iVar7 = pthread_mutex_lock(__mutex);
        if (iVar7 != 0) goto LAB_001a13b1;
        while (uVar12 = *thr_ptr, uVar12 == 1) {
          iVar7 = pthread_cond_wait(__cond,__mutex);
          if (iVar7 != 0) {
LAB_001a1373:
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                          ,0x114,"void mythread_cond_wait(mythread_cond *, mythread_mutex *)");
          }
        }
        local_40 = *(size_t *)((long)thr_ptr + 0x10);
        iVar7 = pthread_mutex_unlock(__mutex);
        if (iVar7 == 0) {
          if (uVar12 < 3) {
            puVar4 = *(undefined8 **)((long)thr_ptr + 0x18);
            puVar4[1] = 0;
            lVar8 = lzma_block_uncomp_encode
                              (block,*(uint8_t **)((long)thr_ptr + 8),local_40,(uint8_t *)*puVar4,
                               puVar4 + 1,local_48);
            if (lVar8 == LZMA_OK) {
LAB_001a1213:
              lVar9 = lzma_block_unpadded_size(block);
              lVar11 = *(long *)((long)thr_ptr + 0x18);
              *(lzma_vli *)(lVar11 + 0x10) = lVar9;
              if (lVar9 == 0) {
                __assert_fail("thr->outbuf->unpadded_size != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                              ,0x152,"worker_state worker_encode(worker_thread *, worker_state)");
              }
              *(undefined8 *)(lVar11 + 0x18) = *(undefined8 *)((long)thr_ptr + 0xa0);
              uVar12 = 2;
            }
            else {
              lVar8 = LZMA_PROG_ERROR;
LAB_001a1206:
              worker_error((worker_thread *)thr_ptr,lVar8);
              uVar12 = 3;
            }
          }
          goto LAB_001a123d;
        }
        break;
      }
      worker_error((worker_thread *)thr_ptr,lVar8);
      uVar12 = 3;
    }
    else {
LAB_001a123d:
      if (uVar12 == 4) {
        iVar7 = pthread_mutex_destroy(__mutex);
        if (iVar7 != 0) {
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                        ,0xbc,"void mythread_mutex_destroy(mythread_mutex *)");
        }
        iVar7 = pthread_cond_destroy(__cond);
        if (iVar7 == 0) {
          lzma_next_end((lzma_next_coder *)((long)thr_ptr + 0x40),
                        *(lzma_allocator **)((long)thr_ptr + 0x28));
          lzma_free(*(void **)((long)thr_ptr + 8),*(lzma_allocator **)((long)thr_ptr + 0x28));
          return (void *)0x0;
        }
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                      ,0x104,"void mythread_cond_destroy(mythread_cond *)");
      }
    }
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) {
LAB_001a13b1:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0xc4,"void mythread_mutex_lock(mythread_mutex *)");
    }
    if (*thr_ptr != 4) {
      *(undefined4 *)thr_ptr = 0;
      iVar7 = pthread_cond_signal(__cond);
      if (iVar7 != 0) goto LAB_001a1392;
    }
    iVar7 = pthread_mutex_unlock(__mutex);
    if (iVar7 != 0) break;
    iVar7 = pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
    if (iVar7 != 0) goto LAB_001a13b1;
    lVar11 = *(long *)((long)thr_ptr + 0x18);
    *(bool *)(lVar11 + 0x20) = uVar12 == 2;
    lVar10 = *(long *)((long)thr_ptr + 0x20);
    *(long *)(lVar10 + 0x158) = *(long *)(lVar10 + 0x158) + *(long *)(lVar11 + 0x18);
    *(long *)(lVar10 + 0x160) = *(long *)(lVar10 + 0x160) + *(long *)(lVar11 + 8);
    *(long *)((long)thr_ptr + 0x30) = 0;
    *(undefined8 *)((long)thr_ptr + 0x38) = 0;
    *(undefined8 *)((long)thr_ptr + 0x158) = *(undefined8 *)(lVar10 + 0x148);
    *(void **)(lVar10 + 0x148) = thr_ptr;
    iVar7 = pthread_cond_signal((pthread_cond_t *)(lVar10 + 400));
    if (iVar7 != 0) {
LAB_001a1392:
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                    ,0x10c,"void mythread_cond_signal(mythread_cond *)");
    }
    iVar7 = pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)thr_ptr + 0x20) + 0x168));
  } while (iVar7 == 0);
LAB_001a130a:
  __assert_fail("ret == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/common/mythread.h"
                ,0xcc,"void mythread_mutex_unlock(mythread_mutex *)");
}

Assistant:

static MYTHREAD_RET_TYPE
worker_start(void *thr_ptr)
{
	worker_thread *thr = thr_ptr;
	worker_state state = THR_IDLE; // Init to silence a warning

	while (true) {
		// Wait for work.
		mythread_sync(thr->mutex) {
			while (true) {
				// The thread is already idle so if we are
				// requested to stop, just set the state.
				if (thr->state == THR_STOP) {
					thr->state = THR_IDLE;
					mythread_cond_signal(&thr->cond);
				}

				state = thr->state;
				if (state != THR_IDLE)
					break;

				mythread_cond_wait(&thr->cond, &thr->mutex);
			}
		}

		assert(state != THR_IDLE);
		assert(state != THR_STOP);

		if (state <= THR_FINISH)
			state = worker_encode(thr, state);

		if (state == THR_EXIT)
			break;

		// Mark the thread as idle unless the main thread has
		// told us to exit. Signal is needed for the case
		// where the main thread is waiting for the threads to stop.
		mythread_sync(thr->mutex) {
			if (thr->state != THR_EXIT) {
				thr->state = THR_IDLE;
				mythread_cond_signal(&thr->cond);
			}
		}

		mythread_sync(thr->coder->mutex) {
			// Mark the output buffer as finished if
			// no errors occurred.
			thr->outbuf->finished = state == THR_FINISH;

			// Update the main progress info.
			thr->coder->progress_in
					+= thr->outbuf->uncompressed_size;
			thr->coder->progress_out += thr->outbuf->size;
			thr->progress_in = 0;
			thr->progress_out = 0;

			// Return this thread to the stack of free threads.
			thr->next = thr->coder->threads_free;
			thr->coder->threads_free = thr;

			mythread_cond_signal(&thr->coder->cond);
		}
	}

	// Exiting, free the resources.
	mythread_mutex_destroy(&thr->mutex);
	mythread_cond_destroy(&thr->cond);

	lzma_next_end(&thr->block_encoder, thr->allocator);
	lzma_free(thr->in, thr->allocator);
	return MYTHREAD_RET_VALUE;
}